

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O3

void __thiscall QStandardItem::setRowCount(QStandardItem *this,int rows)

{
  int row;
  QStandardItemPrivate *this_00;
  int iVar1;
  long in_FS_OFFSET;
  QList<QStandardItem_*> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  row = this_00->rows;
  if (row - rows != 0) {
    if (rows <= row) {
      iVar1 = 0;
      if (0 < rows) {
        iVar1 = rows;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        removeRows(this,iVar1,row - rows);
        return;
      }
      goto LAB_005438d2;
    }
    iVar1 = 0;
    if (0 < row) {
      iVar1 = row;
    }
    local_28.d.d = (Data *)0x0;
    local_28.d.ptr = (QStandardItem **)0x0;
    local_28.d.size = 0;
    QStandardItemPrivate::insertRows
              (this_00,row,(row >> 0x1f & iVar1 - row) + (rows - row),&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_005438d2:
  __stack_chk_fail();
}

Assistant:

void QStandardItem::setRowCount(int rows)
{
    int rc = rowCount();
    if (rc == rows)
        return;
    if (rc < rows)
        insertRows(qMax(rc, 0), rows - rc);
    else
        removeRows(qMax(rows, 0), rc - rows);
}